

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_entry_list_t.c
# Opt level: O1

MMDB_entry_data_list_s * test_uint16_value(MMDB_entry_data_list_s *entry_data_list)

{
  MMDB_entry_data_list_s *pMVar1;
  
  pMVar1 = entry_data_list->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x10e,(pMVar1->entry_data).type,"==",5,"\'uint16\' key\'s value is an uint16",0);
  ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
            ,0x110,(uint)((pMVar1->entry_data).field_1.uint16 == 100),"uint16 field is 100",0);
  return pMVar1;
}

Assistant:

MMDB_entry_data_list_s *
test_uint16_value(MMDB_entry_data_list_s *entry_data_list) {
    MMDB_entry_data_list_s *value = entry_data_list = entry_data_list->next;

    cmp_ok(value->entry_data.type,
           "==",
           MMDB_DATA_TYPE_UINT16,
           "'uint16' key's value is an uint16");
    uint16_t expect = 100;
    ok(value->entry_data.uint16 == expect, "uint16 field is 100");

    return entry_data_list;
}